

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O1

int __thiscall TPZPolynomial::SetRoots(TPZPolynomial *this)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  int iVar11;
  undefined1 auVar10 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  TPZManVector<double,_3> X;
  TPZManVector<double,_3> local_70;
  double local_38;
  undefined8 uStack_30;
  long lVar12;
  
  TPZManVector<double,_3>::TPZManVector(&local_70,3);
  auVar1 = _DAT_014f8350;
  iVar7 = 0;
  iVar11 = 0;
  lVar3 = 0;
  do {
    pdVar6 = (this->fCo).fStore + lVar3;
    iVar7 = iVar7 + (uint)(ABS(*pdVar6) < this->fTolerance);
    iVar11 = iVar11 + (uint)(ABS(pdVar6[1]) < this->fTolerance);
    lVar3 = lVar3 + 2;
  } while (lVar3 != 4);
  if (iVar11 + iVar7 == 4) {
    pdVar6 = (this->fReal).fStore;
    *pdVar6 = 0.0;
    pdVar6[1] = 0.0;
    pdVar6[2] = 0.0;
    iVar7 = 1;
  }
  else {
    pdVar6 = (this->fCo).fStore;
    if ((this->fTolerance <= ABS(*pdVar6)) || (this->fTolerance <= ABS(pdVar6[1]))) {
      lVar3 = 0;
      auVar10 = _DAT_014f8340;
      do {
        if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffd) {
          local_70.super_TPZVec<double>.fStore[lVar3] = -99.999;
          local_70.super_TPZVec<double>.fStore[lVar3 + 1] = -99.999;
        }
        lVar3 = lVar3 + 2;
        lVar12 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar12 + 2;
      } while (lVar3 != 4);
      uVar4 = 0;
      dVar14 = pdVar6[2] + 1.0;
      do {
        dVar8 = pdVar6[2];
        dVar13 = pdVar6[3] * 3.0 * dVar14 * dVar14 + (dVar8 + dVar8) * dVar14 + pdVar6[1];
        uVar5 = 0x2712;
        if (this->fTolerance <= ABS(dVar13)) {
          *local_70.super_TPZVec<double>.fStore =
               dVar14 - (pdVar6[1] * dVar14 +
                         pdVar6[3] * dVar14 * dVar14 * dVar14 + dVar8 * dVar14 * dVar14 + *pdVar6) /
                        dVar13;
          uVar5 = uVar4 + 1;
        }
        uVar4 = uVar5;
        dVar8 = *local_70.super_TPZVec<double>.fStore;
        if (ABS(dVar14 - dVar8) <= this->fTolerance) {
          uVar4 = 0x2711;
        }
        dVar14 = dVar8;
      } while ((int)uVar4 < 10000);
      if ((uVar4 & 0x7ffffffd) == 10000) {
        uVar4 = 0;
        dVar14 = dVar8 * -100000.0;
        do {
          dVar8 = pdVar6[2];
          dVar13 = pdVar6[3] * 3.0 * dVar14 * dVar14 + (dVar8 + dVar8) * dVar14 + pdVar6[1];
          uVar5 = 0x2712;
          if (this->fTolerance < ABS(dVar13)) {
            uVar5 = uVar4 + 1;
            *local_70.super_TPZVec<double>.fStore =
                 dVar14 - (pdVar6[1] * dVar14 +
                           pdVar6[3] * dVar14 * dVar14 * dVar14 + dVar8 * dVar14 * dVar14 + *pdVar6)
                          / dVar13;
          }
          uVar4 = uVar5;
          if (ABS(dVar14 - *local_70.super_TPZVec<double>.fStore) <= this->fTolerance) {
            uVar4 = 0x3e9;
          }
          dVar14 = *local_70.super_TPZVec<double>.fStore;
        } while ((int)uVar4 < 10000);
      }
      if ((uVar4 & 0x7ffffffd) == 10000) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= ",0x3e);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,uVar4);
        iVar7 = -1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      else {
        dVar14 = pdVar6[3];
        dVar8 = *local_70.super_TPZVec<double>.fStore;
        local_38 = pdVar6[2];
        dVar13 = *pdVar6;
        dVar15 = pdVar6[1];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Resultado da 1a raiz na equacao",0x1f);
        poVar2 = std::ostream::_M_insert<double>
                           (dVar13 + dVar15 * dVar8 +
                                     dVar14 * dVar8 * dVar8 * dVar8 + local_38 * dVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        pdVar6 = (this->fCo).fStore;
        dVar14 = pdVar6[3];
        dVar8 = *local_70.super_TPZVec<double>.fStore * dVar14 + pdVar6[2];
        dVar15 = *local_70.super_TPZVec<double>.fStore * dVar8 + pdVar6[1];
        dVar13 = dVar8 * dVar8 + dVar15 * -4.0 * dVar14;
        if (0.0 <= dVar13) {
          dVar9 = SQRT(dVar13);
          dVar15 = dVar9;
          dVar16 = -dVar8;
          if (dVar13 < 0.0) {
            uStack_30 = 0x8000000000000000;
            local_38 = -dVar8;
            dVar15 = sqrt(dVar13);
            dVar16 = local_38;
          }
          local_70.super_TPZVec<double>.fStore[1] = (dVar16 - dVar15) / (dVar14 + dVar14);
          if (dVar13 < 0.0) {
            dVar9 = sqrt(dVar13);
          }
          local_70.super_TPZVec<double>.fStore[2] = (dVar9 - dVar8) / (dVar14 + dVar14);
          pdVar6 = local_70.super_TPZVec<double>.fStore + 3;
          std::
          __introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                    (local_70.super_TPZVec<double>.fStore,pdVar6,2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =",0x3f);
          poVar2 = std::ostream::_M_insert<double>(dVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<double>(*local_70.super_TPZVec<double>.fStore);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x >= + ",7);
          poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x <= + ",7);
          poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x + ",4);
          poVar2 = std::ostream::_M_insert<double>(*(this->fCo).fStore);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = 0.0\n",7);
          poVar2 = std::ostream::_M_insert<double>(dVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x<= + ",6);
          poVar2 = std::ostream::_M_insert<double>(dVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x + ",4);
          poVar2 = std::ostream::_M_insert<double>(dVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = 0.0\n",7);
          pdVar6 = local_70.super_TPZVec<double>.fStore + 3;
          local_70.super_TPZVec<double>.fStore[1] = 0.0;
          local_70.super_TPZVec<double>.fStore[2] = 0.0;
          std::
          __introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                    (local_70.super_TPZVec<double>.fStore,pdVar6,2);
        }
        std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (local_70.super_TPZVec<double>.fStore,pdVar6);
        iVar7 = 1;
        TPZVec<double>::operator=(&this->fReal,&local_70.super_TPZVec<double>);
      }
    }
    else {
      *local_70.super_TPZVec<double>.fStore = pdVar6[2] / pdVar6[3];
      local_70.super_TPZVec<double>.fStore[1] = 0.0;
      local_70.super_TPZVec<double>.fStore[2] = 0.0;
      std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (local_70.super_TPZVec<double>.fStore,local_70.super_TPZVec<double>.fStore + 3,2);
      std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (local_70.super_TPZVec<double>.fStore,local_70.super_TPZVec<double>.fStore + 3);
      iVar7 = 1;
      TPZVec<double>::operator=(&this->fReal,&local_70.super_TPZVec<double>);
    }
  }
  TPZManVector<double,_3>::~TPZManVector(&local_70);
  return iVar7;
}

Assistant:

int TPZPolynomial::SetRoots() {
    TPZManVector<REAL,3> X(3);
	REAL x;
    REAL tol = -99.999;
    REAL der;
    int i, j;
    int zero = 0;
    for (i = 0; i < 4; i++)
        if (fabs(fCo[i]) < fTolerance) zero++;
    if (zero == 4) {
        for (i = 0; i < 3; i++) fReal[i] = 0.000;
        return 1;
    }
    else {
        if (fabs(fCo[0]) < fTolerance && fabs(fCo[1]) < fTolerance) {
            X[0] = fCo[2] / fCo[3];
            X[1] = 0.0;
            X[2] = 0.0;
			sort(&X[0], &X[3], greater<REAL>());
			fReal = X;
//			copy(&X[0], &X[3], &fReal[0]);
        }
        else {
            // Primeira aproximacao
            for (i = 0; i < 3; i++) X[i] = -99.999;
            x = fCo[2] + 1.0;
            j = 0;
            while (j < 10000) {
                j++;
                der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                if (fabs(der) < fTolerance) j = 10002;
                else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                tol = fabs(x - X[0]);
                if (tol <= fTolerance) j = 10001;
                x = X[0];
            }
            //Caso falhe a primeira aproxima��o
            if (j == 10002 || j == 10000) {
                x = -1e5 * x;
                j = 0;
                while (j < 10000) {
                    j++;
                    der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                    if (fabs(der) <= fTolerance) j = 10002;
                    else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                    tol = fabs(x - X[0]);
                    if (tol <= fTolerance) j = 1001;
                    x = X[0];
                }
            }
            if (j == 10002 || j == 10000) {
                cout << "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= " << j << "\n";
                return -1;
            }
            REAL teste;
            teste = fCo[3] * X[0] * X[0] * X[0] + fCo[2] * X[0] + fCo[1] * X[0] + fCo[0];
            cout << "Resultado da 1a raiz na equacao" << teste << "\n";
            //Fim do calculo da primeira raiz (X[0])
            //Reducao da equacao caracteristica de grau 2.
			REAL  b1, b2, b3;
			b3 = fCo[3];
			b2 = fCo[2] + X[0] * b3;
			b1 = fCo[1] + X[0] * b2;
			
            /** Calculo das outras duas raizes (X[1] e X[2]) b3*x^2 + b2*x + b1 = 0 */
            REAL delta;
            delta = b2 * b2 - 4.0 * b1 * b3;
            if (delta < 0.0) {
                cerr << "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =" << delta << "\t" << X[0] << "\n";
                cout << fCo[3] << "x >= + " << fCo[2] << "x <= + " << fCo[1] << "x + " << fCo[0] << " = 0.0\n";
                cout << b3 << "x<= + " << b2 << "x + " << b1 << " = 0.0\n";
                X[1] = 0.0;
                X[2] = 0.0;
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
            else {
                X[1] = (-b2 - sqrt(delta)) / (2.0 * b3);
                X[2] = (-b2 + sqrt(delta)) / (2.0 * b3);
                // Ordenando as tensoes de forma crescente
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
        }
    }
    return 1;
}